

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_StoreTimesEqual(int *pTimes1,int *pTimes2,int nVars)

{
  int local_28;
  int i;
  int nVars_local;
  int *pTimes2_local;
  int *pTimes1_local;
  
  local_28 = 0;
  while( true ) {
    if (nVars <= local_28) {
      return 1;
    }
    if (pTimes1[local_28] != pTimes2[local_28]) break;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

static inline int Ses_StoreTimesEqual( int * pTimes1, int * pTimes2, int nVars )
{
    int i;
    for ( i = 0; i < nVars; ++i )
        if ( pTimes1[i] != pTimes2[i] )
            return 0;
    return 1;
}